

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImVec2 *in_RSI;
  ImVec2 IVar4;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff98;
  ImVec2 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImVec2 size_00;
  float id_00;
  float fVar5;
  bool local_1;
  
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    IVar2 = ImGuiWindow::GetID((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                               ,(char *)in_stack_ffffffffffffffb0);
    size_00 = *in_RSI;
    IVar4 = CalcItemSize(size_00,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    id_00 = IVar4.x;
    fVar5 = IVar4.y;
    operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x1764d6);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffb8,&(pIVar3->DC).CursorPos,
                   (ImVec2 *)&stack0xffffffffffffffb0);
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
    bVar1 = ItemAdd((ImRect *)size_00,(ImGuiID)in_stack_ffffffffffffffc4,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      local_1 = ButtonBehavior((ImRect *)CONCAT44(IVar2,fVar5),(ImGuiID)id_00,(bool *)size_00,
                               (bool *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               ,(ImGuiButtonFlags)in_stack_ffffffffffffffbc);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    // Cannot use zero-size for InvisibleButton(). Unlike Button() there is not way to fallback using the label size.
    IM_ASSERT(size_arg.x != 0.0f && size_arg.y != 0.0f);

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    return pressed;
}